

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# element.c
# Opt level: O2

int ixmlElement_removeAttributeNode(IXML_Element *element,IXML_Attr *oldAttr,IXML_Attr **rtAttr)

{
  IXML_Attr *srcNode;
  Nodeptr_conflict p_Var1;
  Nodeptr_conflict p_Var2;
  int iVar3;
  int iVar4;
  IXML_Node_conflict *oldAttrNode;
  Nodeptr_conflict *pp_Var5;
  Nodeptr_conflict *pp_Var6;
  
  if (oldAttr == (IXML_Attr *)0x0 || element == (IXML_Element *)0x0) {
    iVar4 = 0x69;
  }
  else {
    iVar4 = 8;
    pp_Var5 = &(element->n).firstAttr;
    pp_Var6 = pp_Var5;
    while (srcNode = (IXML_Attr *)*pp_Var6, srcNode != (IXML_Attr *)0x0) {
      iVar3 = ixmlNode_compare((IXML_Node_conflict *)srcNode,&oldAttr->n);
      if (iVar3 == 1) {
        p_Var1 = (srcNode->n).prevSibling;
        p_Var2 = (srcNode->n).nextSibling;
        if (p_Var1 != (Nodeptr_conflict)0x0) {
          p_Var1->nextSibling = p_Var2;
        }
        if (p_Var2 != (Nodeptr_conflict)0x0) {
          p_Var2->prevSibling = p_Var1;
        }
        if ((IXML_Attr *)*pp_Var5 == srcNode) {
          *pp_Var5 = p_Var2;
        }
        (srcNode->n).parentNode = (Nodeptr_conflict)0x0;
        (srcNode->n).prevSibling = (Nodeptr_conflict)0x0;
        (srcNode->n).nextSibling = (Nodeptr_conflict)0x0;
        *rtAttr = srcNode;
        return 0;
      }
      pp_Var6 = &(srcNode->n).nextSibling;
    }
  }
  return iVar4;
}

Assistant:

int ixmlElement_removeAttributeNode(
	IXML_Element *element, IXML_Attr *oldAttr, IXML_Attr **rtAttr)
{
	IXML_Node *attrNode;
	IXML_Node *preSib;
	IXML_Node *nextSib;

	if (element == NULL || oldAttr == NULL) {
		return IXML_INVALID_PARAMETER;
	}

	attrNode = ixmlElement_findAttributeNode(element, oldAttr);
	if (attrNode != NULL) {
		/* Has the attribute */
		preSib = attrNode->prevSibling;
		nextSib = attrNode->nextSibling;
		if (preSib != NULL) {
			preSib->nextSibling = nextSib;
		}
		if (nextSib != NULL) {
			nextSib->prevSibling = preSib;
		}
		if (element->n.firstAttr == attrNode) {
			element->n.firstAttr = nextSib;
		}
		attrNode->parentNode = NULL;
		attrNode->prevSibling = NULL;
		attrNode->nextSibling = NULL;
		*rtAttr = (IXML_Attr *)attrNode;
		return IXML_SUCCESS;
	} else {
		return IXML_NOT_FOUND_ERR;
	}
}